

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  bool bVar1;
  Index IVar2;
  Offset OVar3;
  reference pvVar4;
  size_type sVar5;
  Location local_50;
  Enum local_30;
  uint local_2c;
  Offset OStack_28;
  Index defined_index;
  Offset size_local;
  BinaryReaderInterp *pBStack_18;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  OStack_28 = size;
  size_local._4_4_ = index;
  pBStack_18 = this;
  IVar2 = num_func_imports(this);
  local_2c = index - IVar2;
  pvVar4 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::operator[]
                     (&this->module_->funcs,(ulong)local_2c);
  this->func_ = pvVar4;
  OVar3 = Istream::end(this->istream_);
  this->func_->code_offset = OVar3;
  FixupMap::Clear(&this->depth_fixups_);
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::clear(&this->label_stack_);
  FixupMap::Resolve(&this->func_fixups_,this->istream_,size_local._4_4_);
  GetLocation(&local_50,this);
  local_30 = (Enum)SharedValidator::BeginFunctionBody(&this->validator_,&local_50,size_local._4_4_);
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar5 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::size
                      (&this->func_->handlers);
    PushLabel(this,Try,0xffffffff,0xffffffff,(u32)sVar5);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  // The fixups map is keyed by actual function index (not defined_index)
  // (function imports don't have code and won't appear in the fixups map,
  // but they still use function indexes)
  func_fixups_.Resolve(istream_, index);

  CHECK_RESULT(validator_.BeginFunctionBody(GetLocation(), index));

  // Push implicit func label (equivalent to return).
  // With exception handling it acts as a catch-less try block, which is
  // needed to support delegating to the caller of a function using the
  // try-delegate instruction.
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  return Result::Ok;
}